

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O1

Expression *
slang::ast::UnboundedLiteral::fromSyntax(ASTContext *context,LiteralExpressionSyntax *syntax)

{
  Scope *pSVar1;
  Compilation *this;
  Expression *pEVar2;
  Type *args;
  SourceRange sourceRange;
  SourceRange local_28;
  
  if ((syntax->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind !=
      WildcardLiteralExpression) {
    assert::assertFailed
              ("syntax.kind == SyntaxKind::WildcardLiteralExpression",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
               ,0xc0,
               "static Expression &slang::ast::UnboundedLiteral::fromSyntax(const ASTContext &, const LiteralExpressionSyntax &)"
              );
  }
  pSVar1 = (context->scope).ptr;
  if (pSVar1 != (Scope *)0x0) {
    this = pSVar1->compilation;
    if (((context->flags).m_bits & 0x800) == 0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(context,(DiagCode)0x8e0007,sourceRange);
      pEVar2 = Expression::badExpr(this,(Expression *)0x0);
      return pEVar2;
    }
    args = Compilation::getUnboundedType(this);
    local_28 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pEVar2 = &BumpAllocator::
              emplace<slang::ast::UnboundedLiteral,slang::ast::Type_const&,slang::SourceRange>
                        (&this->super_BumpAllocator,args,&local_28)->super_Expression;
    return pEVar2;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
            );
}

Assistant:

Expression& UnboundedLiteral::fromSyntax(const ASTContext& context,
                                         const LiteralExpressionSyntax& syntax) {
    ASSERT(syntax.kind == SyntaxKind::WildcardLiteralExpression);

    auto& comp = context.getCompilation();
    if (!context.flags.has(ASTFlags::AllowUnboundedLiteral)) {
        context.addDiag(diag::UnboundedNotAllowed, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    return *comp.emplace<UnboundedLiteral>(comp.getUnboundedType(), syntax.sourceRange());
}